

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::CopyTextureSubImage1DAndCheckErrors
          (CopyTest *this,GLuint texture,GLint level,GLint xoffset,GLint x,GLint y,GLsizei width)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1e0 [2];
  MessageBuilder local_1c0;
  int local_3c;
  long lStack_38;
  GLenum error;
  Functions *gl;
  GLint local_28;
  GLint y_local;
  GLint x_local;
  GLint xoffset_local;
  GLint level_local;
  GLuint texture_local;
  CopyTest *this_local;
  
  gl._4_4_ = y;
  local_28 = x;
  y_local = xoffset;
  x_local = level;
  xoffset_local = texture;
  _level_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_38 + 0x1218))(0x8ce0);
  err = (**(code **)(lStack_38 + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x13ec);
  (**(code **)(lStack_38 + 0x388))(xoffset_local,x_local,y_local,local_28,gl._4_4_,width);
  local_3c = (**(code **)(lStack_38 + 0x800))();
  bVar4 = local_3c == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1c0,
                        (char (*) [54])"glCopyTextureSubImage1D unexpectedly generated error ");
    EVar5 = glu::getErrorStr(local_3c);
    local_1e0[0].m_getName = EVar5.m_getName;
    local_1e0[0].m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])0x2a850ac);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  }
  return bVar4;
}

Assistant:

bool CopyTest::CopyTextureSubImage1DAndCheckErrors(glw::GLuint texture, glw::GLint level, glw::GLint xoffset,
												   glw::GLint x, glw::GLint y, glw::GLsizei width)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	gl.copyTextureSubImage1D(texture, level, xoffset, x, y, width);

	/* Check errors. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glCopyTextureSubImage1D unexpectedly generated error "
											<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}